

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  bool bVar2;
  VkAllocationCallbacks *pVVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  Parameters *extraout_RDX;
  allocator<char> local_969;
  string local_968;
  string local_948;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  Resources res;
  Environment local_728;
  EnvClone resEnv;
  
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&resCallbacks,pVVar3,0x80);
  pPVar1 = context->m_platformInterface;
  pDVar4 = Context::getDeviceInterface(context);
  pVVar5 = Context::getDevice(context);
  rootEnv.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar6 = context->m_progCollection;
  rootEnv.allocationCallbacks =
       &resCallbacks.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  rootEnv.maxResourceConsumers = 1;
  rootEnv.vkp = pPVar1;
  rootEnv.vkd = pDVar4;
  rootEnv.device = pVVar5;
  rootEnv.programBinaries = pPVar6;
  res.colorAttachment.resources.image._0_8_ = getDefaulDeviceParameters(context);
  EnvClone::EnvClone(&resEnv,&rootEnv,(Parameters *)&res,(deUint32)pPVar6);
  Framebuffer::Resources::Resources(&res,&resEnv.env,extraout_RDX);
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&objCallbacks,pVVar3,0x80);
  local_728.allocationCallbacks =
       &objCallbacks.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_728.vkp = resEnv.env.vkp;
  local_728.vkd = resEnv.env.vkd;
  local_728.device = resEnv.env.device;
  local_728.queueFamilyIndex = resEnv.env.queueFamilyIndex;
  local_728.programBinaries = resEnv.env.programBinaries;
  local_728.maxResourceConsumers = resEnv.env.maxResourceConsumers;
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_948,&local_728,&res,
                      (Parameters *)(ulong)resEnv.env.queueFamilyIndex);
  local_968.field_2._M_allocated_capacity = local_948.field_2._M_allocated_capacity;
  local_968.field_2._8_8_ = local_948.field_2._8_8_;
  local_968._M_dataplus._M_p = local_948._M_dataplus._M_p;
  local_968._M_string_length = local_948._M_string_length;
  local_948._M_dataplus._M_p = (pointer)0x0;
  local_948._M_string_length = 0;
  local_948.field_2._M_allocated_capacity = 0;
  local_948.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_948);
  bVar2 = ::vk::validateAndLog(context->m_testCtx->m_log,&objCallbacks,0x1e);
  if (bVar2) {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_968);
    bVar2 = ::vk::validateAndLog(context->m_testCtx->m_log,&objCallbacks,0);
    if (bVar2) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&objCallbacks);
      Framebuffer::Resources::~Resources(&res);
      EnvClone::~EnvClone(&resEnv);
      bVar2 = ::vk::validateAndLog(context->m_testCtx->m_log,&resCallbacks,0);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resEnv,"Ok",(allocator<char> *)&res);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&resEnv);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resEnv,"Invalid allocation callback",(allocator<char> *)&res);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&resEnv);
      }
      std::__cxx11::string::~string((string *)&resEnv);
      goto LAB_0047f0cd;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_968,"Invalid allocation callback",(allocator<char> *)&local_948);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_968);
    std::__cxx11::string::~string((string *)&local_968);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_948,"Invalid allocation callback",&local_969);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_968);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&objCallbacks);
  Framebuffer::Resources::~Resources(&res);
  EnvClone::~EnvClone(&resEnv);
LAB_0047f0cd:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&resCallbacks);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}